

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  bool bVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int *piVar5;
  SPxId *pSVar6;
  Status *pSVar7;
  undefined8 in_RCX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000008;
  int in_stack_00000020;
  int in_stack_00000028;
  int bestNr;
  int nr;
  int *last;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *up;
  bool enterrowrep;
  bool leaving;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa80;
  Desc *in_stack_fffffffffffffa88;
  bool local_54d;
  undefined1 local_54c [56];
  undefined1 local_514 [56];
  undefined4 local_4dc;
  undefined1 local_4d8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  undefined1 local_468 [56];
  undefined1 local_430 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  undefined1 local_3c0 [56];
  SPxColId local_388;
  int local_380;
  int local_37c;
  int *local_378;
  int *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  bool local_346;
  byte local_345;
  undefined1 local_344 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_30c;
  int local_2d4;
  undefined8 local_2c8;
  undefined8 local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  undefined8 local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 *local_220;
  undefined8 local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1d9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_199;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_d9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_99;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_2a0 = &local_30c;
  local_2c8 = in_R8;
  local_2c0 = in_RCX;
  local_2b8 = in_RDX;
  local_2b0 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
  local_298 = local_344;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
  local_345 = *(int *)(in_RDI + 0x18) == 1;
  local_54d = false;
  if (!(bool)local_345) {
    local_54d = *(int *)(*(long *)(in_RDI + 8) + 0x400) == -1;
  }
  local_346 = local_54d;
  local_350 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x399fef);
  local_358 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x39a004);
  local_360 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x39a019);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta(in_stack_00000008);
  local_368 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::values((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x39a036);
  this_00 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::delta(in_stack_00000008);
  piVar5 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::indexMem(this_00);
  local_370 = piVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta(in_stack_00000008);
  iVar4 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::size((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x39a07d);
  local_378 = piVar5 + iVar4;
  local_37c = -1;
  local_380 = -1;
  for (local_370 = local_370 + in_stack_00000020; local_370 < local_378;
      local_370 = local_370 + in_stack_00000028) {
    local_2d4 = *local_370;
    local_1f0 = local_368 + local_2d4;
    local_1e8 = &local_30c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    if (((local_345 & 1) == 0) ||
       ((((*(byte *)(in_RDI + 0x110) & 1) == 0 ||
         (bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isCoBasic(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c), !bVar1)) &&
        (((*(byte *)(in_RDI + 0x110) & 1) != 0 ||
         (bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c), !bVar1)))))) {
      bVar1 = false;
      if ((local_346 & 1U) != 0) {
        pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
        bVar2 = SPxId::isSPxColId(pSVar6);
        bVar1 = false;
        if (bVar2) {
          in_stack_fffffffffffffa88 =
               SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)(*(long *)(in_RDI + 8) + 0x1f0));
          in_stack_fffffffffffffa80 =
               *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(in_RDI + 8);
          pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
          SPxColId::SPxColId(&local_388,pSVar6);
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::number(&in_stack_fffffffffffffa80->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(SPxColId *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::Desc::colStatus((Desc *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
          bVar1 = *pSVar7 == P_FIXED;
        }
      }
      if (!bVar1) {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x39a27c);
        if (tVar3) {
          local_90 = local_350 + local_2d4;
          local_98 = local_360 + local_2d4;
          local_88 = &local_3f8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_99,local_90,local_98);
          local_80 = &local_3f8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
          local_68 = &local_3f8;
          local_70 = local_90;
          local_78 = local_98;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     (cpp_dec_float<50U,_int,_void> *)0x39a35a);
          local_188 = local_3c0;
          local_190 = &local_3f8;
          local_198 = &local_30c;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_199,local_190,local_198);
          local_180 = local_3c0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
          local_168 = local_3c0;
          local_170 = local_190;
          local_178 = local_198;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     (cpp_dec_float<50U,_int,_void> *)0x39a411);
          local_248 = local_344;
          local_250 = local_3c0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          tVar3 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x39a458);
          if (tVar3) {
            local_1f8 = local_2b0;
            local_200 = local_344;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            local_37c = local_2d4;
            local_208 = local_2b8;
            local_210 = &local_30c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          }
          else {
            tVar3 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x39a4ed);
            if (tVar3) {
              local_218 = local_2c0;
              local_220 = local_344;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              local_380 = local_2d4;
            }
          }
        }
        else {
          local_20 = local_430;
          local_28 = local_2b8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_2b8);
          local_10 = local_430;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          local_8 = local_430;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
          tVar3 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x39a5d9);
          if (tVar3) {
            local_d0 = local_358 + local_2d4;
            local_d8 = local_360 + local_2d4;
            local_c8 = &local_4a0;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_d9,local_d0,local_d8);
            local_c0 = &local_4a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
            local_a8 = &local_4a0;
            local_b0 = local_d0;
            local_b8 = local_d8;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                       (cpp_dec_float<50U,_int,_void> *)0x39a6b7);
            local_1c8 = local_468;
            local_1d0 = &local_4a0;
            local_1d8 = &local_30c;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1d9,local_1d0,local_1d8);
            local_1c0 = local_468;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
            local_1a8 = local_468;
            local_1b0 = local_1d0;
            local_1b8 = local_1d8;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                       (cpp_dec_float<50U,_int,_void> *)0x39a76e);
            local_258 = local_344;
            local_260 = local_468;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            tVar3 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x39a7b5);
            if (tVar3) {
              local_228 = local_2b0;
              local_230 = local_344;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              local_37c = local_2d4;
              local_50 = local_4d8;
              local_58 = &local_30c;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_59,local_58);
              local_40 = local_4d8;
              local_48 = local_58;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              local_38 = local_4d8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
              local_268 = local_2b8;
              local_270 = local_4d8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            }
            else {
              tVar3 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x39a8d4);
              if (tVar3) {
                local_238 = local_2c0;
                local_240 = local_344;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
                local_380 = local_2d4;
              }
            }
          }
        }
      }
    }
  }
  if ((local_37c < 0) && (0 < local_380)) {
    local_4dc = 0;
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffa88,(int *)in_stack_fffffffffffffa80);
    if (tVar3) {
      local_110 = local_350 + local_380;
      local_118 = local_360 + local_380;
      local_108 = local_514;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_119,local_110,local_118);
      local_100 = local_514;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
      local_e8 = local_514;
      local_f0 = local_110;
      local_f8 = local_118;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (cpp_dec_float<50U,_int,_void> *)0x39aa6b);
      local_278 = local_2c8;
      local_280 = local_514;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    }
    else {
      local_150 = local_360 + local_380;
      local_158 = local_358 + local_380;
      local_148 = local_54c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_159,local_150,local_158);
      local_140 = local_54c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80);
      local_128 = local_54c;
      local_130 = local_150;
      local_138 = local_158;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (cpp_dec_float<50U,_int,_void> *)0x39ab6e);
      local_288 = local_2c8;
      local_290 = local_54c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffa80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    }
  }
  return local_37c;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}